

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O1

int dlmalloc_trim(size_t pad)

{
  int iVar1;
  size_t in_RSI;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  iVar1 = sys_trim((mstate)pad,in_RSI);
  return iVar1;
}

Assistant:

int dlmalloc_trim(size_t pad) {
  int result = 0;
  ensure_initialization();
  if (!PREACTION(gm)) {
    result = sys_trim(gm, pad);
    POSTACTION(gm);
  }
  return result;
}